

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::begin_array
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          json_visitor *visitor,error_code *ec)

{
  bool bVar1;
  uint uVar2;
  type_conflict tVar3;
  size_type sVar4;
  parse_mode *__args;
  bson_errc __e;
  error_code *in_RDX;
  ser_context *in_RDI;
  type_conflict length;
  size_t n;
  uint8_t buf [4];
  error_code *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
  *in_stack_ffffffffffffffe0;
  
  sVar4 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
          size((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
               (in_RDI + 0x13));
  __e = (bson_errc)sVar4;
  uVar2 = bson_options_common::max_nesting_depth
                    ((bson_options_common *)
                     (in_RDI[5]._vptr_ser_context[-3] + (long)&in_RDI[5]._vptr_ser_context));
  if ((int)uVar2 < (int)__e) {
    std::error_code::operator=
              ((error_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),__e);
    *(undefined1 *)&in_RDI[1]._vptr_ser_context = 0;
  }
  else {
    __args = (parse_mode *)
             bytes_source::read((bytes_source *)(in_RDI + 2),(int)&stack0xffffffffffffffe4,
                                (void *)0x4,(ulong)uVar2);
    if (__args == (parse_mode *)0x4) {
      tVar3 = binary::little_to_native<int,jsoncons::detail::endian>(&stack0xffffffffffffffe4,4);
      basic_json_visitor<char>::begin_array
                ((basic_json_visitor<char> *)CONCAT44(tVar3,in_stack_ffffffffffffffd0),
                 (semantic_tag)(__e >> 0x18),in_RDI,in_stack_ffffffffffffffb8);
      *(byte *)&in_RDI[1]._vptr_ser_context =
           (*(byte *)((long)&in_RDI[1]._vptr_ser_context + 2) ^ 0xff) & 1;
      bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
      if (!bVar1) {
        std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
        emplace_back<jsoncons::bson::parse_mode,int&,unsigned_long&>
                  (in_stack_ffffffffffffffe0,__args,(int *)CONCAT44(tVar3,3),
                   (unsigned_long *)CONCAT44(__e,in_stack_ffffffffffffffc8));
      }
    }
    else {
      std::error_code::operator=
                ((error_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),__e);
      *(undefined1 *)&in_RDI[1]._vptr_ser_context = 0;
    }
  }
  return;
}

Assistant:

void begin_array(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(static_cast<int>(state_stack_.size()) > options_.max_nesting_depth()))
        {
            ec = bson_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 
        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        auto length = binary::little_to_native<int32_t>(buf, sizeof(buf));

        visitor.begin_array(semantic_tag::none, *this, ec);
        more_ = !cursor_mode_;
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        state_stack_.emplace_back(parse_mode::array, length, n);
    }